

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_editor.cpp
# Opt level: O2

size_t __thiscall cmd_obj::render(cmd_obj *this,size_t buf_idx,size_t limit,string *sequence)

{
  ulong uVar1;
  size_t sVar2;
  string local_50;
  
  uVar1 = (this->super_edit_object).buflen;
  sVar2 = uVar1 - buf_idx;
  if (limit + buf_idx <= uVar1) {
    sVar2 = limit;
  }
  if (buf_idx < 10) {
    std::__cxx11::string::assign((char *)sequence);
    if (sVar2 + buf_idx < 0xb) {
      value_abi_cxx11_(&local_50,this);
      std::__cxx11::string::append((string *)sequence,(ulong)&local_50,buf_idx);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)sequence);
      return sVar2;
    }
    value_abi_cxx11_(&local_50,this);
    std::__cxx11::string::append((string *)sequence,(ulong)&local_50,buf_idx);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)sequence);
    value_abi_cxx11_(&local_50,this);
    std::__cxx11::string::append((string *)sequence,(ulong)&local_50,10);
  }
  else {
    value_abi_cxx11_(&local_50,this);
    std::__cxx11::string::assign((string *)sequence,(ulong)&local_50,buf_idx);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return sVar2;
}

Assistant:

virtual size_t render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        if ((buf_idx + limit) > length())
            limit = length() - buf_idx;

        if (buf_idx >= 10) {
            sequence.assign(value(), buf_idx, limit);
        }
        else {
            sequence.assign(COLOR_KEYWORD);
            if ((buf_idx + limit) <= 10) {
                sequence.append(value(), buf_idx, limit);
                sequence.append(COLOR_NORMAL);
            }
            else {
                sequence.append(value(), buf_idx, 10 - buf_idx);
                sequence.append(COLOR_NORMAL);
                sequence.append(value(), 10, limit - (10 - buf_idx));
            }
        }

        return limit;
    }